

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

ssize_t __thiscall
helics::CommonCore::send(CommonCore *this,int __fd,void *__buf,size_t __n,int __flags)

{
  string_view string2;
  string_view message_00;
  string_view message_01;
  string_view string1;
  bool bVar1;
  BasicHandleInfo *this_00;
  char *pcVar2;
  undefined8 uVar3;
  FederateState *this_01;
  Time __str;
  ssize_t extraout_RAX;
  __sv_type string3;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_00000050;
  ActionMessage *in_stack_00000058;
  CommonCore *in_stack_00000060;
  ActionMessage message;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  FederateState *fed;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *hndl;
  CommonCore *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  ActionMessage *this_02;
  char *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  GlobalFederateId in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar4;
  action_t in_stack_fffffffffffffe6c;
  undefined4 uVar5;
  ActionMessage *in_stack_fffffffffffffe70;
  CommonCore *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe90 [16];
  
  this_00 = (BasicHandleInfo *)
            getHandleInfo(in_stack_fffffffffffffe48,
                          (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  if (this_00 == (BasicHandleInfo *)0x0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    message_00._M_len._4_4_ = in_stack_fffffffffffffe6c;
    message_00._M_len._0_4_ = in_stack_fffffffffffffe68;
    message_00._M_str = pcVar2;
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)
               CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),message_00);
    __cxa_throw(pcVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if (this_00->handleType == ENDPOINT) {
    this_01 = getFederateAt(in_stack_fffffffffffffe80,
                            (LocalFederateId)in_stack_fffffffffffffe90._4_4_);
    FederateState::getMessageDestinations
              (in_stack_fffffffffffffe90._0_8_,(InterfaceHandle)in_stack_fffffffffffffe90._12_4_);
    bVar1 = std::
            vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::empty((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60));
    if (!bVar1) {
      ActionMessage::ActionMessage(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      in_stack_fffffffffffffe64 = BasicHandleInfo::getFederateId(this_00);
      __str = FederateState::nextAllowedSendTime(this_01);
      SmallBuffer::assign((SmallBuffer *)
                          CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),
                          (void *)__str.internalTimeCode,(size_t)in_stack_fffffffffffffe50);
      std::__atomic_base<int>::operator++(&(this->messageCounter).super___atomic_base<int>);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),
                 (char *)__str.internalTimeCode);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe50);
      string3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe50);
      this_02 = (ActionMessage *)string3._M_str;
      string1._M_len._4_4_ = in_stack_fffffffffffffe6c;
      string1._M_len._0_4_ = in_stack_fffffffffffffe68;
      string1._M_str = (char *)in_stack_fffffffffffffe70;
      string2._M_str._0_4_ = in_stack_fffffffffffffe60;
      string2._M_len = __str.internalTimeCode;
      string2._M_str._4_4_ = in_stack_fffffffffffffe64.gid;
      ActionMessage::setStringData(this_02,string1,string2,(string_view)string3);
      generateMessages(in_stack_00000060,in_stack_00000058,in_stack_00000050);
      ActionMessage::~ActionMessage(this_02);
    }
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60));
    return extraout_RAX;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  uVar4 = (undefined4)uVar3;
  uVar5 = (undefined4)((ulong)uVar3 >> 0x20);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  message_01._M_len._4_4_ = uVar5;
  message_01._M_len._0_4_ = uVar4;
  message_01._M_str = (char *)in_stack_fffffffffffffe70;
  InvalidIdentifier::InvalidIdentifier
            ((InvalidIdentifier *)CONCAT44(in_stack_fffffffffffffe64.gid,in_stack_fffffffffffffe60),
             message_01);
  __cxa_throw(CONCAT44(uVar5,uVar4),&InvalidIdentifier::typeinfo,
              InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::send(InterfaceHandle sourceHandle, const void* data, uint64_t length)
{
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto targets = fed->getMessageDestinations(sourceHandle);
    if (targets.empty()) {
        return;
    }

    ActionMessage message(CMD_SEND_MESSAGE);
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.actionTime = fed->nextAllowedSendTime();
    message.payload.assign(data, length);
    message.messageID = ++messageCounter;
    message.setStringData("", hndl->key, hndl->key);
    generateMessages(message, targets);
}